

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_decimal_utils.hpp
# Opt level: O2

hugeint_t duckdb::ParquetDecimalUtils::ReadDecimalValue<duckdb::hugeint_t>
                    (const_data_ptr_t pointer,idx_t size,ParquetColumnSchema *param_3)

{
  data_t dVar1;
  InvalidInputException *this;
  byte bVar2;
  idx_t iVar3;
  byte *pbVar4;
  long lVar5;
  idx_t iVar6;
  allocator local_51;
  hugeint_t res;
  string local_40;
  
  iVar6 = 0;
  hugeint_t::hugeint_t(&res,0);
  iVar3 = 0x10;
  if (size < 0x10) {
    iVar3 = size;
  }
  dVar1 = *pointer;
  bVar2 = (char)dVar1 >> 7;
  pbVar4 = pointer + size;
  for (; pbVar4 = pbVar4 + -1, iVar3 != iVar6; iVar6 = iVar6 + 1) {
    *(byte *)((long)&res.lower + iVar6) = *pbVar4 ^ bVar2;
  }
  if (0x10 < size) {
    lVar5 = size - 0x11;
    while (lVar5 != -1) {
      pbVar4 = pointer + lVar5;
      lVar5 = lVar5 + -1;
      if (*pbVar4 != bVar2) {
        this = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_40,"Invalid decimal encoding in Parquet file",&local_51);
        InvalidInputException::InvalidInputException(this,&local_40);
        __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  if ((char)dVar1 < '\0') {
    hugeint_t::hugeint_t((hugeint_t *)&local_40,1);
    hugeint_t::operator+=(&res,(hugeint_t *)&local_40);
    res = hugeint_t::operator-(&res);
  }
  return res;
}

Assistant:

static PHYSICAL_TYPE ReadDecimalValue(const_data_ptr_t pointer, idx_t size, const ParquetColumnSchema &) {
		PHYSICAL_TYPE res = 0;

		auto res_ptr = (uint8_t *)&res;
		bool positive = (*pointer & 0x80) == 0;

		// numbers are stored as two's complement so some muckery is required
		for (idx_t i = 0; i < MinValue<idx_t>(size, sizeof(PHYSICAL_TYPE)); i++) {
			auto byte = *(pointer + (size - i - 1));
			res_ptr[i] = positive ? byte : byte ^ 0xFF;
		}
		// Verify that there are only 0s here
		if (size > sizeof(PHYSICAL_TYPE)) {
			for (idx_t i = sizeof(PHYSICAL_TYPE); i < size; i++) {
				auto byte = *(pointer + (size - i - 1));
				if (!positive) {
					byte ^= 0xFF;
				}
				if (byte != 0) {
					throw InvalidInputException("Invalid decimal encoding in Parquet file");
				}
			}
		}
		if (!positive) {
			res += 1;
			return -res;
		}
		return res;
	}